

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O3

void pybind11::detail::clear_instance(PyObject *self)

{
  PyTypeObject *t;
  long *plVar1;
  bool bVar2;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var3;
  internals *piVar4;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar5;
  type_info *ptVar6;
  void *valueptr;
  long lVar7;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar9;
  iterator __begin2;
  long *local_60;
  instance *local_58;
  size_t local_50;
  PyTypeObject *in_stack_ffffffffffffffb8;
  type_info *ptVar10;
  PyObject *local_40;
  void *local_38;
  
  t = self->ob_type;
  pVar8 = all_type_info_get_cache(in_stack_ffffffffffffffb8);
  _Var3 = pVar8.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)((long)_Var3.
                           super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                           ._M_cur + 0x10));
  }
  local_60 = *(long **)((long)_Var3.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur + 0x10);
  lVar7 = (long)*(long **)((long)_Var3.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x18) - (long)local_60;
  if (lVar7 == 0) {
    ptVar6 = (type_info *)0x0;
  }
  else {
    ptVar6 = (type_info *)*local_60;
  }
  local_50 = 0;
  local_40 = self + 1;
  if ((self[3].ob_refcnt & 2) == 0) {
    local_40 = (PyObject *)local_40->ob_refcnt;
  }
  local_58 = (instance *)self;
  if (*(long **)((long)_Var3.
                       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                       ._M_cur + 0x18) != local_60) {
    do {
      valueptr = (void *)local_40->ob_refcnt;
      if (valueptr != (void *)0x0) {
        if ((self[3].ob_refcnt & 1) == 0) {
          ptVar10 = ptVar6;
          if ((local_58->field_0x30 & 2) == 0) {
            if (*(char *)((long)(local_58->field_1).simple_value_holder[1] + local_50) == '\x01')
            goto LAB_00113226;
          }
          else if ((local_58->field_0x30 & 4) != 0) goto LAB_00113226;
        }
        else {
LAB_00113226:
          (*ptVar6->dealloc)((value_and_holder *)&local_58);
          valueptr = (void *)local_40->ob_refcnt;
          ptVar10 = ptVar6;
        }
        ptVar6 = ptVar10;
        local_38 = valueptr;
        piVar4 = get_internals();
        pVar9 = std::
                _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                ::equal_range(&(piVar4->registered_instances)._M_h,&local_38);
        __it._M_cur = (__node_type *)
                      pVar9.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
        if ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
            __it._M_cur !=
            pVar9.second.
            super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
           ) {
          do {
            if (self->ob_type == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
              std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::erase(&(piVar4->registered_instances)._M_h,(const_iterator)__it._M_cur);
              bVar2 = true;
              goto LAB_001132a7;
            }
            __it._M_cur = *__it._M_cur;
          } while ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                    )__it._M_cur !=
                   pVar9.second.
                   super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                  );
        }
        bVar2 = false;
LAB_001132a7:
        if ((ptVar10->field_0x80 & 2) == 0) {
          traverse_offset_bases(valueptr,ptVar10,(instance *)self,deregister_instance_impl);
        }
        if (!bVar2) {
          pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
      }
      if ((self[3].ob_refcnt & 2) == 0) {
        local_40 = (PyObject *)(&local_40->ob_type + *(long *)(*local_60 + 0x18));
        ptVar6 = (type_info *)local_60[1];
        local_60 = local_60 + 1;
      }
      local_50 = local_50 + 1;
    } while (local_50 != lVar7 >> 3);
  }
  instance::deallocate_layout((instance *)self);
  if (self[2].ob_type != (PyTypeObject *)0x0) {
    PyObject_ClearWeakRefs(self);
  }
  puVar5 = (undefined8 *)_PyObject_GetDictPtr(self);
  if ((puVar5 != (undefined8 *)0x0) && (plVar1 = (long *)*puVar5, plVar1 != (long *)0x0)) {
    *puVar5 = 0;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      _Py_Dealloc();
    }
  }
  return;
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {
            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);

            if (!deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);
}